

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

SearchStatus __thiscall tsbp::LeftmostActiveOnly::SolveParallelTaskflow(LeftmostActiveOnly *this)

{
  bool bVar1;
  reference piVar2;
  rep rVar3;
  Executor *this_00;
  long in_RDI;
  time_point endTaskflow;
  Future<void> fu;
  Task itemSpecificBranch;
  size_t itemId;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  mutex mutex;
  Packing2D solution;
  atomic<bool> feasibleSolutionCancellationToken;
  atomic<unsigned_long> exploredNodes;
  atomic<unsigned_long> exploredSubtrees;
  SearchStatus status;
  Taskflow taskflow;
  Executor executor;
  size_t numberOfThreads;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  endLast;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  begin;
  memory_order __b;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_680;
  duration<long,_std::ratio<1L,_1000000000L>_> local_678;
  duration<long,_std::ratio<1L,_1000L>_> local_670;
  undefined4 local_664;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_660;
  Future<void> local_658;
  long local_630;
  atomic<bool> *local_620;
  SearchStatus *local_618;
  mutex *local_610;
  Packing2D *local_608;
  atomic<unsigned_long> *local_600;
  atomic<unsigned_long> *local_5f8;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *local_5f0;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *local_5e8;
  FlowBuilder local_5e0;
  long local_5d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_5d0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_5c8;
  vector<int,_std::allocator<int>_> *local_5c0;
  mutex local_5b8;
  Packing2D local_590;
  atomic<bool> local_4e9;
  atomic<unsigned_long> local_4e8;
  atomic<unsigned_long> local_4e0;
  SearchStatus local_4d8 [4];
  Taskflow local_4c8;
  Executor local_400;
  size_t local_e0;
  duration local_d8;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_d0;
  duration local_c8;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_c0 [2];
  SearchStatus local_ac;
  memory_order local_a0;
  undefined4 local_9c;
  atomic<unsigned_long> *local_98;
  
  local_c8.__r = std::chrono::_V2::steady_clock::now();
  std::
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::atomic(local_c0,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     )local_c8.__r);
  local_d8.__r = (rep)std::
                      atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                      ::load(local_c0,seq_cst);
  std::
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::atomic(&local_d0,
           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            )local_d8.__r);
  local_e0 = (size_t)*(int *)(in_RDI + 0x118);
  tf::Executor::Executor(&local_400,local_e0);
  tf::Taskflow::Taskflow(&local_4c8);
  local_4d8[0] = None;
  std::atomic<unsigned_long>::atomic(&local_4e0,0);
  std::atomic<unsigned_long>::atomic(&local_4e8,0);
  std::atomic<bool>::atomic(&local_4e9,false);
  Packing2D::Packing2D(&local_590);
  std::mutex::mutex(&local_5b8);
  local_5c0 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x68);
  local_5c8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_5c0);
  local_5d0._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(local_5c0);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&local_5c8,&local_5d0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_5c8);
    local_630 = (long)*piVar2;
    local_620 = &local_4e9;
    local_618 = local_4d8;
    local_610 = &local_5b8;
    local_608 = &local_590;
    local_600 = &local_4e8;
    local_5f8 = &local_4e0;
    local_5f0 = &local_d0;
    local_5e8 = local_c0;
    local_5d8 = local_630;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ktnr[P]TwoStepBranchingProcedure_tsbp_src_BranchAndBound_cpp:355:13),_nullptr>
              (&local_5e0,(anon_class_80_10_b098ab6f *)&local_4c8);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_5c8);
  }
  this_00 = &local_400;
  tf::Executor::run(&local_658,this_00,&local_4c8);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_658,this_00);
  local_660.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if (local_4d8[0] == Abort) {
    std::operator<<((ostream *)&std::cout,"Search was aborted.\n");
  }
  else {
    bVar1 = std::atomic<bool>::load(&local_4e9,seq_cst);
    if (bVar1) {
      local_4d8[0] = Feasible;
      Packing2D::operator=((Packing2D *)(in_RDI + 400),&local_590);
      std::operator<<((ostream *)&std::cout,"Feasible solution found.\n");
    }
    else {
      local_4d8[0] = Infeasible;
      std::operator<<((ostream *)&std::cout,"Problem is infeasible.\n");
    }
    local_98 = &local_4e8;
    local_9c = 5;
    local_a0 = std::operator&(seq_cst,__memory_order_mask);
    *(undefined4 *)(in_RDI + 0x188) = (undefined4)local_4e8.super___atomic_base<unsigned_long>._M_i;
    local_680 = std::
                atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                ::load(&local_d0,seq_cst);
    local_678.__r = (rep)std::chrono::operator-(&local_660,&local_680);
    local_670.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_678);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_670);
    *(double *)(in_RDI + 0x178) = (double)rVar3;
  }
  local_664 = 1;
  local_ac = local_4d8[0];
  tf::Future<void>::~Future(&local_658);
  Packing2D::~Packing2D(&local_590);
  tf::Taskflow::~Taskflow(&local_4c8);
  tf::Executor::~Executor(&local_400);
  return local_ac;
}

Assistant:

SearchStatus LeftmostActiveOnly::SolveParallelTaskflow()
{
    std::atomic<std::chrono::steady_clock::time_point> begin = std::chrono::steady_clock::now();
    std::atomic<std::chrono::steady_clock::time_point> endLast = begin.load();

    size_t numberOfThreads = this->parameters.LMAOThreads;
    tf::Executor executor(numberOfThreads);
    tf::Taskflow taskflow;

    SearchStatus status = SearchStatus::None;

    std::atomic<size_t> exploredSubtrees(0);
    std::atomic<size_t> exploredNodes(0);
    std::atomic<bool> feasibleSolutionCancellationToken = false;
    Packing2D solution;

    std::mutex mutex;

    for (size_t itemId: this->branchingOrder)
    {
        tf::Task itemSpecificBranch = taskflow.emplace(
            [&, itemId]()
            {
                    // TODO.Performance: write copy assignment constructor for Node to run the preprocess only once. It has its copy assignment constructor disabled because it has a unique_ptr member.
                    ////LeftmostActiveOnly lmaoSubtree = *this;
                    LeftmostActiveOnly lmao(this->parameters);
                    lmao.AddContainer(container);
                    lmao.AddItems(items, itemId, this->fixedItemCoordinatesX);
                    lmao.SetBranchingOrder(this->branchingOrder);
                    lmao.AddCancellationToken(&feasibleSolutionCancellationToken);

                    SearchStatus localStatus = lmao.SolveSequential();
                    if (localStatus == SearchStatus::Abort)
                    {
                        status = localStatus;
                    }

                    if (localStatus == SearchStatus::Feasible)
                    {
                        mutex.lock();
                        solution = lmao.GetSolution();
                        mutex.unlock();
                    }

                    exploredNodes += lmao.GetTreeSize();
                    exploredSubtrees++;

                    std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
                    endLast = end;

                    ////if (this->parameters.LMAOEnableLogging)
                    if (false)
                    {
                        std::cout << "LMAO \t Explored subtrees = " + std::to_string(exploredSubtrees) + " / " + std::to_string(items.size()) + "\n";

                        std::cout << "Elapsed time = " << std::chrono::duration_cast<std::chrono::seconds>(end - begin.load()).count() << "s\n";
                    } });
    }

    // TODO.Performance: Consider prioritizing the reduced domain item and smaller items. It takes the longest to compute and should not come late in the process, s.t. the other threads cannot be used as no computations are left.
    // TODO.Performance: Execution with the taskflow library takes longer in sequential and parallel mode.
    // In sequential mode, the issue seems to be that a task/thread is blocked unitl after it has finished computation *and* until its memory fully deallocated.
    // This also has an impact in parallel mode.
    // Look into async tasks https://taskflow.github.io/taskflow/AsyncTasking.html and parallel algorithms.

    tf::Future<void> fu = executor.run(taskflow);
    fu.wait(); // block until the execution completes

    std::chrono::steady_clock::time_point endTaskflow = std::chrono::steady_clock::now();

    if (status == SearchStatus::Abort)
    {
        std::cout << "Search was aborted.\n";
        return status;
    }

    if (feasibleSolutionCancellationToken.load())
    {
        status = SearchStatus::Feasible;
        this->solution = solution;
        std::cout << "Feasible solution found.\n";
    }
    else
    {
        status = SearchStatus::Infeasible;
        std::cout << "Problem is infeasible.\n";
    }

    ////if (this->parameters.LMAOEnableLogging)
    if (false)
    {
        std::cout << "LMAO \t Total explored nodes = " + std::to_string(exploredNodes.load()) + "\n";
    }

    this->statistics.NodeCount = exploredNodes.load();
    this->statistics.TimeMemoryDeallocation = std::chrono::duration_cast<std::chrono::milliseconds>(endTaskflow - endLast.load()).count();

    return status;
}